

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

float resolve_length(render_state_t *state,length_t *length,char mode)

{
  float fVar1;
  float fVar2;
  
  if (length->type == length_type_percent) {
    if (mode == 'o') {
      fVar2 = hypotf(state->view_width,state->view_height);
      fVar1 = length->value;
      if (length->type == length_type_percent) {
        fVar1 = ((fVar2 / 1.4142135) * fVar1) / 100.0;
      }
    }
    else {
      if (mode == 'y') {
        fVar1 = state->view_height;
      }
      else {
        fVar1 = 0.0;
        if (mode == 'x') {
          fVar1 = state->view_width;
        }
      }
      fVar1 = (fVar1 * length->value) / 100.0;
    }
  }
  else {
    fVar1 = length->value;
  }
  return fVar1;
}

Assistant:

static float resolve_length(const render_state_t* state, const length_t* length, char mode)
{
    float maximum = 0.f;
    if(length->type == length_type_percent) {
        if(mode == 'x') {
            maximum = state->view_width;
        } else if(mode == 'y') {
            maximum = state->view_height;
        } else if(mode == 'o') {
            maximum = hypotf(state->view_width, state->view_height) / PLUTOVG_SQRT2;
        }
    }

    return convert_length(length, maximum);
}